

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_key_share.cc
# Opt level: O2

bool bssl::ssl_name_to_group_id(uint16_t *out_group_id,char *name,size_t len)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  char *__s;
  
  lVar3 = 0x1f8;
  __s = "secp224r1";
  do {
    if (lVar3 == 0) {
LAB_0014e677:
      return lVar3 != 0;
    }
    sVar2 = strlen(__s + -0x20);
    if (sVar2 == len) {
      iVar1 = strncmp(__s + -0x20,name,len);
      if (iVar1 != 0) goto LAB_0014e63a;
LAB_0014e66e:
      *out_group_id = *(uint16_t *)(__s + -0x22);
      goto LAB_0014e677;
    }
LAB_0014e63a:
    sVar2 = strlen(__s);
    if (sVar2 == len && sVar2 != 0) {
      iVar1 = strncmp(__s,name,len);
      if (iVar1 == 0) goto LAB_0014e66e;
    }
    lVar3 = lVar3 + -0x48;
    __s = __s + 0x48;
  } while( true );
}

Assistant:

bool ssl_name_to_group_id(uint16_t *out_group_id, const char *name,
                          size_t len) {
  for (const auto &group : kNamedGroups) {
    if (len == strlen(group.name) &&  //
        !strncmp(group.name, name, len)) {
      *out_group_id = group.group_id;
      return true;
    }
    if (strlen(group.alias) > 0 && len == strlen(group.alias) &&
        !strncmp(group.alias, name, len)) {
      *out_group_id = group.group_id;
      return true;
    }
  }
  return false;
}